

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

void __thiscall
flatbuffers::lobster::LobsterGenerator::StructBuilderBody
          (LobsterGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *name;
  StructDef *struct_def_00;
  pointer ppFVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  char *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  local_d8 = nameprefix;
  NumToString<unsigned_long>(&local_70,struct_def->minalign);
  std::operator+(&local_90,"    b_.Prep(",&local_70);
  std::operator+(&local_118,&local_90,", ");
  NumToString<unsigned_long>(&local_b0,struct_def->bytesize);
  std::operator+(&local_f8,&local_118,&local_b0);
  std::operator+(&local_d0,&local_f8,")\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  ppFVar1 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  while (ppFVar1 !=
         (struct_def->fields).vec.
         super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
         _M_impl.super__Vector_impl_data._M_start) {
    name = ppFVar1[-1];
    if (name->padding != 0) {
      NumToString<unsigned_long>(&local_118,name->padding);
      std::operator+(&local_f8,"    b_.Pad(",&local_118);
      std::operator+(&local_d0,&local_f8,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    ppFVar1 = ppFVar1 + -1;
    if (((name->value).type.base_type == BASE_TYPE_STRUCT) &&
       (struct_def_00 = (name->value).type.struct_def, struct_def_00->fixed == true)) {
      EscapeKeyword(&local_118,this,(string *)name);
      std::operator+(&local_f8,&local_118,"_");
      std::operator+(&local_d0,local_d8,&local_f8);
      StructBuilderBody(this,struct_def_00,local_d0._M_dataplus._M_p,code_ptr);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
    else {
      GenMethod_abi_cxx11_(&local_b0,this,&(name->value).type);
      std::operator+(&local_70,"    b_.Prepend",&local_b0);
      std::operator+(&local_90,&local_70,"(");
      std::operator+(&local_118,&local_90,local_d8);
      EscapeKeyword(&local_50,this,(string *)name);
      std::operator+(&local_f8,&local_118,&local_50);
      std::operator+(&local_d0,&local_f8,")\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_118);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_b0);
    }
  }
  return;
}

Assistant:

void StructBuilderBody(const StructDef &struct_def, const char *nameprefix,
                         std::string *code_ptr) {
    std::string &code = *code_ptr;
    code += "    b_.Prep(" + NumToString(struct_def.minalign) + ", " +
            NumToString(struct_def.bytesize) + ")\n";
    for (auto it = struct_def.fields.vec.rbegin();
         it != struct_def.fields.vec.rend(); ++it) {
      auto &field = **it;
      if (field.padding)
        code += "    b_.Pad(" + NumToString(field.padding) + ")\n";
      if (IsStruct(field.value.type)) {
        StructBuilderBody(*field.value.type.struct_def,
                          (nameprefix + (NormalizedName(field) + "_")).c_str(),
                          code_ptr);
      } else {
        code += "    b_.Prepend" + GenMethod(field.value.type) + "(" +
                nameprefix + NormalizedName(field) + ")\n";
      }
    }
  }